

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleDependenciesTests.cpp
# Opt level: O0

IterateResult __thiscall
glcts::MultisampleTextureDependenciesInvalidRenderbufferStorageMultisampleCalls1Test::iterate
          (MultisampleTextureDependenciesInvalidRenderbufferStorageMultisampleCalls1Test *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar5;
  TestError *this_01;
  MessageBuilder local_1d0;
  int local_4c;
  uint local_48;
  GLint gl_max_internalformat_samples_value;
  GLenum internalformat;
  GLenum error_code;
  uint n_internalformat;
  uint n_noninteger_internalformats;
  GLenum noninteger_internalformats [6];
  GLint gl_max_samples_value;
  Functions *gl;
  MultisampleTextureDependenciesInvalidRenderbufferStorageMultisampleCalls1Test *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  initInternals(this);
  noninteger_internalformats[5] = 0;
  (**(code **)(lVar4 + 0x868))(0x8d57,noninteger_internalformats + 5);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"Could not retrieve GL_MAX_SAMPLES value.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                  ,0x74a);
  _n_internalformat = 0x8d6200008051;
  noninteger_internalformats[0] = 0x8c43;
  noninteger_internalformats[1] = 0x8cac;
  noninteger_internalformats[2] = 0x88f0;
  noninteger_internalformats[3] = 0x8d48;
  error_code = 6;
  internalformat = 0;
  while( true ) {
    if (5 < internalformat) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return STOP;
    }
    gl_max_internalformat_samples_value = 0;
    local_48 = (&n_internalformat)[internalformat];
    local_4c = -1;
    (**(code **)(lVar4 + 0x880))(0x8d41,local_48,0x80a9,1,&local_4c);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glGetInternalformativ() failed to retrieve GL_SAMPLES",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                    ,0x75b);
    (**(code **)(lVar4 + 0x1240))(0x8d41,local_4c + 1,local_48,1);
    gl_max_internalformat_samples_value = (**(code **)(lVar4 + 0x800))();
    if (gl_max_internalformat_samples_value != 0x502) break;
    internalformat = internalformat + 1;
    gl_max_internalformat_samples_value = 0x502;
  }
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<(&local_1d0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<
                     (&local_1d0,
                      (char (*) [57])"glRenderbufferStorageMultisample() generated error code ");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(uint *)&gl_max_internalformat_samples_value);
  pMVar5 = tcu::MessageBuilder::operator<<
                     (pMVar5,(char (*) [41])" when GL_INVALID_OPERATION was expected.");
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1d0);
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Invalid error code generated by glRenderbufferStorageMultisample() call.",
             (char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
             ,0x768);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

tcu::TestNode::IterateResult MultisampleTextureDependenciesInvalidRenderbufferStorageMultisampleCalls1Test::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	initInternals();

	/* Retrieve GL_MAX_SAMPLES pname value */
	glw::GLint gl_max_samples_value = 0;

	gl.getIntegerv(GL_MAX_SAMPLES, &gl_max_samples_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not retrieve GL_MAX_SAMPLES value.");

	/* Iterate through a set of valid non-integer internalformats */
	const glw::GLenum noninteger_internalformats[] = {
		GL_RGB8, GL_RGB565, GL_SRGB8_ALPHA8, GL_DEPTH_COMPONENT32F, GL_DEPTH24_STENCIL8, GL_STENCIL_INDEX8
	};
	const unsigned int n_noninteger_internalformats =
		sizeof(noninteger_internalformats) / sizeof(noninteger_internalformats[0]);

	for (unsigned int n_internalformat = 0; n_internalformat < n_noninteger_internalformats; ++n_internalformat)
	{
		glw::GLenum		  error_code						  = GL_NO_ERROR;
		const glw::GLenum internalformat					  = noninteger_internalformats[n_internalformat];
		glw::GLint		  gl_max_internalformat_samples_value = -1;

		/* Retrieve maximum amount of samples available for the texture target considered */
		gl.getInternalformativ(GL_RENDERBUFFER, internalformat, GL_SAMPLES, 1, &gl_max_internalformat_samples_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetInternalformativ() failed to retrieve GL_SAMPLES");

		/* Execute the test */
		gl.renderbufferStorageMultisample(GL_RENDERBUFFER, gl_max_internalformat_samples_value + 1, internalformat,
										  1,  /* width */
										  1); /* height */

		error_code = gl.getError();
		if (error_code != GL_INVALID_OPERATION)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "glRenderbufferStorageMultisample() generated error code "
							   << error_code << " when GL_INVALID_OPERATION was expected." << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid error code generated by glRenderbufferStorageMultisample() call.");
		}
	} /* for (all internalformats) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}